

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  iVar2 = lhs1->exp_;
  iVar9 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + iVar2;
  iVar3 = lhs2->exp_;
  iVar10 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + iVar3;
  iVar6 = iVar10;
  if (iVar10 < iVar9) {
    iVar6 = iVar9;
  }
  uVar13 = (uint)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = rhs->exp_;
  iVar1 = iVar4 + uVar13;
  if (iVar6 + 1 < iVar1) {
LAB_001a2189:
    iVar7 = -1;
  }
  else if (iVar1 < iVar6) {
LAB_001a2197:
    iVar7 = 1;
  }
  else {
    iVar6 = iVar2;
    if (iVar3 < iVar2) {
      iVar6 = iVar3;
    }
    if (iVar4 < iVar6) {
      iVar6 = iVar4;
    }
    iVar7 = 0;
    if (iVar6 < iVar1) {
      uVar11 = 0;
      do {
        uVar13 = uVar13 - 1;
        iVar7 = iVar4 + uVar13 + 1;
        if (iVar9 < iVar7 || iVar7 <= iVar2) {
          uVar5 = 0;
        }
        else {
          uVar5 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[(iVar4 - iVar2) + uVar13];
        }
        if (iVar10 < iVar7 || iVar7 <= iVar3) {
          uVar12 = 0;
        }
        else {
          uVar12 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[(iVar4 - iVar3) + uVar13];
        }
        if (iVar1 < iVar7 || iVar7 <= iVar4) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar13];
        }
        uVar8 = uVar8 | uVar11;
        uVar12 = uVar12 + uVar5;
        if (uVar8 < uVar12) goto LAB_001a2197;
        if (1 < uVar8 - uVar12) goto LAB_001a2189;
        uVar11 = uVar8 - uVar12 << 0x20;
      } while (iVar6 < (int)(iVar4 + uVar13));
      iVar7 = -(uint)(uVar8 != uVar12);
    }
  }
  return iVar7;
}

Assistant:

int num_bigits() const { return static_cast<int>(bigits_.size()) + exp_; }